

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O0

bool testExtendAndPrepend<CyclicHash<unsigned_long_long,unsigned_char>>(uint L)

{
  undefined8 uVar1;
  bool bVar2;
  long lVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __end;
  unsigned_long_long uVar4;
  ostream *poVar5;
  void *pvVar6;
  uchar *puVar7;
  unsigned_long_long uVar8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_958;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_950;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_948;
  const_iterator j;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_938;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_930;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_928;
  undefined1 local_920 [8];
  string prepend;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8f0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8e8;
  undefined1 local_8e0 [8];
  string extend;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8b8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8b0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8a8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8a0;
  undefined1 local_898 [8];
  string base;
  allocator local_861;
  string local_860 [8];
  string input;
  CyclicHash<unsigned_long_long,_unsigned_char> hf;
  uint n;
  uint L_local;
  
  CyclicHash<unsigned_long_long,_unsigned_char>::CyclicHash
            ((CyclicHash<unsigned_long_long,_unsigned_char> *)((long)&input.field_2 + 8),4,L);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_860,"XABCDY",&local_861);
  std::allocator<char>::~allocator((allocator<char> *)&local_861);
  local_8a8._M_current = (char *)std::__cxx11::string::begin();
  local_8a0 = __gnu_cxx::
              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator+(&local_8a8,1);
  local_8b8._M_current = (char *)std::__cxx11::string::end();
  local_8b0 = __gnu_cxx::
              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator-(&local_8b8,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((string *)local_898,local_8a0,local_8b0,
             (allocator<char> *)(extend.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(extend.field_2._M_local_buf + 0xf));
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 4) {
    __assert_fail("base.size() == n",
                  "/workspace/llm4binary/github/license_c_cmakelists/lemire[P]rollinghashcpp/tests/unit.cpp"
                  ,0x11,
                  "bool testExtendAndPrepend(uint) [hashfunction = CyclicHash<unsigned long long>]")
    ;
  }
  local_8f0._M_current = (char *)std::__cxx11::string::begin();
  local_8e8 = __gnu_cxx::
              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator+(&local_8f0,1);
  __end._M_current = (char *)std::__cxx11::string::end();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((string *)local_8e0,local_8e8,__end,
             (allocator<char> *)(prepend.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(prepend.field_2._M_local_buf + 0xf));
  local_928._M_current = (char *)std::__cxx11::string::begin();
  local_938._M_current = (char *)std::__cxx11::string::end();
  local_930 = __gnu_cxx::
              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator-(&local_938,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((string *)local_920,local_928,local_930,(allocator<char> *)((long)&j._M_current + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&j._M_current + 7));
  local_950._M_current = (char *)std::__cxx11::string::begin();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_948,&local_950);
  while( true ) {
    local_958._M_current = (char *)std::__cxx11::string::end();
    bVar2 = __gnu_cxx::operator!=(&local_948,&local_958);
    uVar1 = input.field_2._8_8_;
    if (!bVar2) break;
    puVar7 = (uchar *)__gnu_cxx::
                      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*(&local_948);
    CyclicHash<unsigned_long_long,_unsigned_char>::eat
              ((CyclicHash<unsigned_long_long,_unsigned_char> *)((long)&input.field_2 + 8),*puVar7);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_948);
  }
  uVar4 = CyclicHash<unsigned_long_long,unsigned_char>::hash<std::__cxx11::string>
                    ((CyclicHash<unsigned_long_long,unsigned_char> *)
                     (input.field_2._M_local_buf + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_898)
  ;
  if (uVar1 == uVar4) {
    puVar7 = (uchar *)std::__cxx11::string::operator[]((ulong)local_860);
    uVar4 = CyclicHash<unsigned_long_long,_unsigned_char>::hash_prepend
                      ((CyclicHash<unsigned_long_long,_unsigned_char> *)((long)&input.field_2 + 8),
                       *puVar7);
    uVar8 = CyclicHash<unsigned_long_long,unsigned_char>::hash<std::__cxx11::string>
                      ((CyclicHash<unsigned_long_long,unsigned_char> *)
                       (input.field_2._M_local_buf + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_920);
    if (uVar4 == uVar8) {
      puVar7 = (uchar *)std::__cxx11::string::back();
      uVar4 = CyclicHash<unsigned_long_long,_unsigned_char>::hash_extend
                        ((CyclicHash<unsigned_long_long,_unsigned_char> *)((long)&input.field_2 + 8)
                         ,*puVar7);
      uVar8 = CyclicHash<unsigned_long_long,unsigned_char>::hash<std::__cxx11::string>
                        ((CyclicHash<unsigned_long_long,unsigned_char> *)
                         (input.field_2._M_local_buf + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_8e0);
      if (uVar4 == uVar8) {
        uVar4 = CyclicHash<unsigned_long_long,unsigned_char>::hash<std::__cxx11::string>
                          ((CyclicHash<unsigned_long_long,unsigned_char> *)
                           (input.field_2._M_local_buf + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_898);
        if (input.field_2._8_8_ != uVar4) {
          __assert_fail("hf.hashvalue == hf.hash(base)",
                        "/workspace/llm4binary/github/license_c_cmakelists/lemire[P]rollinghashcpp/tests/unit.cpp"
                        ,0x2a,
                        "bool testExtendAndPrepend(uint) [hashfunction = CyclicHash<unsigned long long>]"
                       );
        }
        puVar7 = (uchar *)std::__cxx11::string::operator[]((ulong)local_860);
        uVar4 = CyclicHash<unsigned_long_long,_unsigned_char>::hash_prepend
                          ((CyclicHash<unsigned_long_long,_unsigned_char> *)
                           ((long)&input.field_2 + 8),*puVar7);
        uVar8 = CyclicHash<unsigned_long_long,unsigned_char>::hash<std::__cxx11::string>
                          ((CyclicHash<unsigned_long_long,unsigned_char> *)
                           (input.field_2._M_local_buf + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_920);
        if (uVar4 != uVar8) {
          __assert_fail("hf.hash_prepend(input[0]) == hf.hash(prepend)",
                        "/workspace/llm4binary/github/license_c_cmakelists/lemire[P]rollinghashcpp/tests/unit.cpp"
                        ,0x2b,
                        "bool testExtendAndPrepend(uint) [hashfunction = CyclicHash<unsigned long long>]"
                       );
        }
        puVar7 = (uchar *)std::__cxx11::string::back();
        uVar4 = CyclicHash<unsigned_long_long,_unsigned_char>::hash_extend
                          ((CyclicHash<unsigned_long_long,_unsigned_char> *)
                           ((long)&input.field_2 + 8),*puVar7);
        uVar8 = CyclicHash<unsigned_long_long,unsigned_char>::hash<std::__cxx11::string>
                          ((CyclicHash<unsigned_long_long,unsigned_char> *)
                           (input.field_2._M_local_buf + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_8e0);
        if (uVar4 != uVar8) {
          __assert_fail("hf.hash_extend(input.back()) == hf.hash(extend)",
                        "/workspace/llm4binary/github/license_c_cmakelists/lemire[P]rollinghashcpp/tests/unit.cpp"
                        ,0x2c,
                        "bool testExtendAndPrepend(uint) [hashfunction = CyclicHash<unsigned long long>]"
                       );
        }
        n._3_1_ = true;
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cout,"bug!");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        poVar5 = std::operator<<((ostream *)&std::cout,(string *)local_8e0);
        poVar5 = std::operator<<(poVar5," ");
        puVar7 = (uchar *)std::__cxx11::string::back();
        uVar4 = CyclicHash<unsigned_long_long,_unsigned_char>::hash_extend
                          ((CyclicHash<unsigned_long_long,_unsigned_char> *)
                           ((long)&input.field_2 + 8),*puVar7);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar4);
        poVar5 = std::operator<<(poVar5," ");
        uVar4 = CyclicHash<unsigned_long_long,unsigned_char>::hash<std::__cxx11::string>
                          ((CyclicHash<unsigned_long_long,unsigned_char> *)
                           (input.field_2._M_local_buf + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_8e0);
        pvVar6 = (void *)std::ostream::operator<<(poVar5,uVar4);
        std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
        n._3_1_ = false;
      }
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,"bug!");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<((ostream *)&std::cout,(string *)local_920);
      poVar5 = std::operator<<(poVar5," ");
      puVar7 = (uchar *)std::__cxx11::string::operator[]((ulong)local_860);
      uVar4 = CyclicHash<unsigned_long_long,_unsigned_char>::hash_prepend
                        ((CyclicHash<unsigned_long_long,_unsigned_char> *)((long)&input.field_2 + 8)
                         ,*puVar7);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar4);
      poVar5 = std::operator<<(poVar5," ");
      uVar4 = CyclicHash<unsigned_long_long,unsigned_char>::hash<std::__cxx11::string>
                        ((CyclicHash<unsigned_long_long,unsigned_char> *)
                         (input.field_2._M_local_buf + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_920);
      pvVar6 = (void *)std::ostream::operator<<(poVar5,uVar4);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
      n._3_1_ = false;
    }
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,"bug!");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)local_898);
    poVar5 = std::operator<<(poVar5," ");
    uVar4 = CyclicHash<unsigned_long_long,unsigned_char>::hash<std::__cxx11::string>
                      ((CyclicHash<unsigned_long_long,unsigned_char> *)
                       (input.field_2._M_local_buf + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_898);
    pvVar6 = (void *)std::ostream::operator<<(poVar5,uVar4);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    n._3_1_ = false;
  }
  std::__cxx11::string::~string((string *)local_920);
  std::__cxx11::string::~string((string *)local_8e0);
  std::__cxx11::string::~string((string *)local_898);
  std::__cxx11::string::~string(local_860);
  return n._3_1_;
}

Assistant:

bool testExtendAndPrepend(uint L = 19) {
  const uint n(4); // n-grams
  hashfunction hf(n, L);
  string input = "XABCDY";
  string base(input.begin() + 1, input.end() - 1);
  assert(base.size() == n);
  string extend(input.begin() + 1, input.end());
  string prepend(input.begin(), input.end() - 1);

  for (string::const_iterator j = base.begin(); j != base.end(); ++j) {
    hf.eat(*j);
  }
  if (hf.hashvalue != hf.hash(base)) {
    std::cout << "bug!" << std::endl;
    std::cout << base << " " << hf.hash(base) << std::endl;
    return false;
  }
  if (hf.hash_prepend(input[0]) != hf.hash(prepend)) {
    std::cout << "bug!" << std::endl;
    std::cout << prepend << " " << hf.hash_prepend(input[0]) << " "
              << hf.hash(prepend) << std::endl;
    return false;
  }
  if (hf.hash_extend(input.back()) != hf.hash(extend)) {
    std::cout << "bug!" << std::endl;
    std::cout << extend << " " << hf.hash_extend(input.back()) << " "
              << hf.hash(extend) << std::endl;
    return false;
  }

  assert(hf.hashvalue == hf.hash(base));
  assert(hf.hash_prepend(input[0]) == hf.hash(prepend));
  assert(hf.hash_extend(input.back()) == hf.hash(extend));

  return true;
}